

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::ArrayBuffer::ArrayBuffer<void*(*)(unsigned_long)>
          (ArrayBuffer *this,uint32 length,DynamicType *type,_func_void_ptr_unsigned_long *allocator
          )

{
  bool bVar1;
  ScriptContext *pSVar2;
  Type *this_00;
  JavascriptLibrary *this_01;
  HeapAllocator *alloc;
  RefCountedBuffer *this_02;
  TrackAllocData local_68;
  RefCountedBuffer *localContent;
  Recycler *recycler;
  BYTE *buffer;
  _func_void_ptr_unsigned_long *allocator_local;
  DynamicType *type_local;
  ArrayBuffer *pAStack_10;
  uint32 length_local;
  ArrayBuffer *this_local;
  
  buffer = (BYTE *)allocator;
  allocator_local = (_func_void_ptr_unsigned_long *)type;
  type_local._4_4_ = length;
  pAStack_10 = this;
  ArrayBufferBase::ArrayBufferBase(&this->super_ArrayBufferBase,type);
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfa988;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_>::WriteBarrierPtr
            (&this->primaryParent);
  Memory::WriteBarrierPtr<Js::ArrayBuffer::OtherParents>::WriteBarrierPtr(&this->otherParents);
  this->bufferContent = (Type)0x0;
  this->bufferLength = 0;
  if (0x7fffffff < type_local._4_4_) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec37,(PCWSTR)0x0);
  }
  if (type_local._4_4_ != 0) {
    recycler = (Recycler *)0x0;
    this_00 = RecyclableObject::GetType((RecyclableObject *)this);
    this_01 = Js::Type::GetLibrary(this_00);
    localContent = (RefCountedBuffer *)JavascriptLibrary::GetRecycler(this_01);
    bVar1 = Memory::Recycler::RequestExternalMemoryAllocation
                      ((Recycler *)localContent,(ulong)type_local._4_4_);
    if ((bVar1) &&
       (recycler = (Recycler *)(*(code *)buffer)(type_local._4_4_), recycler == (Recycler *)0x0)) {
      Memory::Recycler::ReportExternalMemoryFree((Recycler *)localContent,(ulong)type_local._4_4_);
    }
    if (recycler == (Recycler *)0x0) {
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>((Recycler *)localContent);
      bVar1 = Memory::Recycler::RequestExternalMemoryAllocation
                        ((Recycler *)localContent,(ulong)type_local._4_4_);
      if ((bVar1) &&
         (recycler = (Recycler *)(*(code *)buffer)(type_local._4_4_), recycler == (Recycler *)0x0))
      {
        Memory::Recycler::ReportExternalMemoryFailure
                  ((Recycler *)localContent,(ulong)type_local._4_4_);
      }
    }
    if (recycler == (Recycler *)0x0) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowOutOfMemoryError(pSVar2);
    }
    this->bufferLength = type_local._4_4_;
    memset(recycler,0,(ulong)this->bufferLength);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&RefCountedBuffer::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
               ,0x2b4);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_68);
    this_02 = (RefCountedBuffer *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    RefCountedBuffer::RefCountedBuffer(this_02,(BYTE *)recycler);
    this->bufferContent = this_02;
  }
  return;
}

Assistant:

ArrayBuffer::ArrayBuffer(uint32 length, DynamicType * type, Allocator allocator) :
        ArrayBufferBase(type), bufferContent(nullptr), bufferLength(0)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }
        else if (length > 0)
        {
            BYTE * buffer = nullptr;
            Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
            if (recycler->RequestExternalMemoryAllocation(length))
            {
                buffer = (BYTE*)allocator(length);
                if (buffer == nullptr)
                {
                    recycler->ReportExternalMemoryFree(length);
                }
            }

            if (buffer == nullptr)
            {
                recycler->CollectNow<CollectOnTypedArrayAllocation>();

                if (recycler->RequestExternalMemoryAllocation(length))
                {
                    buffer = (BYTE*)allocator(length);
                    if (buffer == nullptr)
                    {
                        recycler->ReportExternalMemoryFailure(length);
                    }
                }
            }

            if (buffer == nullptr)
            {
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            else
            {
                bufferLength = length;
                ZeroMemory(buffer, bufferLength);
                RefCountedBuffer* localContent = HeapNew(RefCountedBuffer, buffer);
                this->bufferContent = localContent;
            }
        }
    }